

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O0

void pbrt::CheckCallbackScope::Fail(void)

{
  bool bVar1;
  undefined8 uVar2;
  reverse_iterator iter;
  string message;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>_>_>
  *in_stack_ffffffffffffff78;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>_>_>
  *in_stack_ffffffffffffff80;
  FILE *__stream;
  reference in_stack_ffffffffffffff88;
  string local_60 [64];
  string local_20 [32];
  
  PrintStackTrace();
  std::__cxx11::string::string(local_20);
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
  ::rbegin((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
            *)in_stack_ffffffffffffff88);
  while( true ) {
    std::
    vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
    ::rend((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>
            *)in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (!bVar1) break;
    in_stack_ffffffffffffff88 =
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>_>_>
         ::operator*(in_stack_ffffffffffffff80);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(in_stack_ffffffffffffff88);
    std::__cxx11::string::operator+=(local_20,local_60);
    std::__cxx11::string::~string(local_60);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_*,_std::vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>_>_>_>_>
    ::operator++(in_stack_ffffffffffffff80);
  }
  __stream = _stderr;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s\n\n",uVar2);
  abort();
}

Assistant:

void CheckCallbackScope::Fail() {
    PrintStackTrace();

    std::string message;
    for (auto iter = callbacks.rbegin(); iter != callbacks.rend(); ++iter)
        message += (*iter)();
    fprintf(stderr, "%s\n\n", message.c_str());

#if defined(_DEBUG) && defined(_MSC_VER)
    // When debugging on windows, avoid the obnoxious dialog and make
    // it possible to continue past a LOG(FATAL) in the debugger
    __debugbreak();
#else
    abort();
#endif
}